

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordSet.cpp
# Opt level: O3

void __thiscall DIS::RecordSet::RecordSet(RecordSet *this)

{
  this->_vptr_RecordSet = (_func_int **)&PTR__RecordSet_001a0d30;
  this->_recordID = 0;
  this->_recordSetSerialNumber = 0;
  *(undefined8 *)((long)&this->_recordSetSerialNumber + 3) = 0;
  return;
}

Assistant:

RecordSet::RecordSet():
   _recordID(0), 
   _recordSetSerialNumber(0), 
   _recordLength(0), 
   _recordCount(0), 
   _recordValues(0), 
   _pad4(0)
{
}